

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_firstwrite(Curl_easy *data,connectdata *conn,_Bool *done)

{
  undefined1 *puVar1;
  int *piVar2;
  ushort uVar3;
  long lVar4;
  _Bool _Var5;
  
  *done = false;
  if ((data->req).newurl != (char *)0x0) {
    if (((uint)conn->bits & 0x40) != 0) goto LAB_0060c7d3;
    puVar1 = &(data->req).field_0xbb;
    *puVar1 = *puVar1 | 0x20;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Ignoring the response-body");
    }
  }
  lVar4 = (data->state).resume_from;
  if ((((lVar4 == 0) || (uVar3 = *(ushort *)&(data->req).field_0xbb, (uVar3 & 2) != 0)) ||
      ((uVar3 & 0x20) != 0)) || ((data->state).httpreq != '\0')) {
    if ((data->set).timecondition == '\0') {
      return CURLE_OK;
    }
    if ((data->state).range != (char *)0x0) {
      return CURLE_OK;
    }
    _Var5 = Curl_meets_timecondition(data,(data->req).timeofdoc);
    if (_Var5) {
      return CURLE_OK;
    }
    *done = true;
    (data->info).httpcode = 0x130;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Simulate an HTTP 304 response");
    }
    Curl_conncontrol(conn,2);
    return CURLE_OK;
  }
  if ((data->req).size != lVar4) {
    Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
    Curl_infof(data,"The entire document is already downloaded");
  }
  Curl_conncontrol(conn,2);
LAB_0060c7d3:
  piVar2 = &(data->req).keepon;
  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
  *done = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_firstwrite(struct Curl_easy *data,
                              struct connectdata *conn,
                              bool *done)
{
  struct SingleRequest *k = &data->req;

  *done = FALSE;
  if(data->req.newurl) {
    if(conn->bits.close) {
      /* Abort after the headers if "follow Location" is set
         and we're set to close anyway. */
      k->keepon &= ~KEEP_RECV;
      *done = TRUE;
      return CURLE_OK;
    }
    /* We have a new url to load, but since we want to be able to reuse this
       connection properly, we read the full response in "ignore more" */
    k->ignorebody = TRUE;
    infof(data, "Ignoring the response-body");
  }
  if(data->state.resume_from && !k->content_range &&
     (data->state.httpreq == HTTPREQ_GET) &&
     !k->ignorebody) {

    if(k->size == data->state.resume_from) {
      /* The resume point is at the end of file, consider this fine even if it
         doesn't allow resume from here. */
      infof(data, "The entire document is already downloaded");
      streamclose(conn, "already downloaded");
      /* Abort download */
      k->keepon &= ~KEEP_RECV;
      *done = TRUE;
      return CURLE_OK;
    }

    /* we wanted to resume a download, although the server doesn't seem to
     * support this and we did this with a GET (if it wasn't a GET we did a
     * POST or PUT resume) */
    failf(data, "HTTP server doesn't seem to support "
          "byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }

  if(data->set.timecondition && !data->state.range) {
    /* A time condition has been set AND no ranges have been requested. This
       seems to be what chapter 13.3.4 of RFC 2616 defines to be the correct
       action for an HTTP/1.1 client */

    if(!Curl_meets_timecondition(data, k->timeofdoc)) {
      *done = TRUE;
      /* We're simulating an HTTP 304 from server so we return
         what should have been returned from the server */
      data->info.httpcode = 304;
      infof(data, "Simulate an HTTP 304 response");
      /* we abort the transfer before it is completed == we ruin the
         reuse ability. Close the connection */
      streamclose(conn, "Simulated 304 handling");
      return CURLE_OK;
    }
  } /* we have a time condition */

  return CURLE_OK;
}